

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O1

void set_obj_color_proc(Am_Object param_1,Am_Object *obj,Am_Value *new_value)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object local_28;
  
  Am_Object::Am_Object(&local_28,(Am_Object *)&Am_Line);
  cVar2 = Am_Object::Is_Instance_Of((Am_Object)obj);
  uVar4 = 1;
  if (cVar2 == '\0') {
    Am_Object::Am_Object(&local_30,&freehand_line_proto);
    cVar3 = Am_Object::Is_Instance_Of((Am_Object)obj);
    if (cVar3 == '\0') {
      Am_Object::Am_Object(&AStack_38,(Am_Object *)&Am_Text);
      uVar4 = Am_Object::Is_Instance_Of((Am_Object)obj);
      bVar1 = true;
      goto LAB_0010be99;
    }
  }
  bVar1 = false;
LAB_0010be99:
  if (bVar1) {
    Am_Object::~Am_Object(&AStack_38);
  }
  if (cVar2 == '\0') {
    Am_Object::~Am_Object(&local_30);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Object::Set((ushort)obj,(Am_Value *)(ulong)(uVar4 & 0xff | 0x6a),(ulong)new_value);
  return;
}

Assistant:

Am_Define_Method(Am_Set_Object_Property_Value_Method, void, set_obj_color,
                 (Am_Object /* command_obj */, Am_Object obj,
                  Am_Value new_value))
{
  if (obj.Is_Instance_Of(Am_Line) || obj.Is_Instance_Of(freehand_line_proto) ||
      obj.Is_Instance_Of(Am_Text))
    obj.Set(Am_LINE_STYLE, new_value);
  else
    obj.Set(Am_FILL_STYLE, new_value);
}